

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseProtocol.cpp
# Opt level: O0

void tonk::protocol::GenerateS2CCookieResponse(uint64_t cookie,uint8_t *datagram)

{
  undefined2 *in_RSI;
  uint64_t in_RDI;
  
  *(undefined1 *)(in_RSI + 1) = 0;
  *in_RSI = 0;
  handshake::WriteS2CCookieResponse((uint8_t *)((long)in_RSI + 3),in_RDI);
  *(undefined1 *)((long)in_RSI + 0xf) = 0xe0;
  in_RSI[8] = 0;
  return;
}

Assistant:

void GenerateS2CCookieResponse(uint64_t cookie, uint8_t* datagram)
{
    // Write timestamp = 0
    siamese::WriteU24_LE(datagram, 0);
    datagram += protocol::kTimestampBytes;

    handshake::WriteS2CCookieResponse(datagram, cookie);
    datagram += kHandshakeBytes;

    // Write flags byte
    datagram[0] = kHandshakeMask | kConnectionMask | kSeqCompMask;
    ++datagram;

    // Write hash value = 0
    siamese::WriteU16_LE(datagram, 0);
    static_assert(kMessageFrameBytes == 2, "Update this");
}